

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

char * ImStrchrRange(char *str,char *str_end,char c)

{
  while( true ) {
    if (str_end <= str) {
      return (char *)0x0;
    }
    if (*str == c) break;
    str = str + 1;
  }
  return str;
}

Assistant:

const char* ImStrchrRange(const char* str, const char* str_end, char c)
{
    for ( ; str < str_end; str++)
        if (*str == c)
            return str;
    return NULL;
}